

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O1

void __thiscall CConnman::NodesSnapshot::~NodesSnapshot(NodesSnapshot *this)

{
  long lVar1;
  pointer ppCVar2;
  CNode **node;
  pointer ppCVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ppCVar2 = (this->m_nodes_copy).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar3 = (this->m_nodes_copy).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppCVar3 != ppCVar2; ppCVar3 = ppCVar3 + 1) {
    LOCK();
    ((*ppCVar3)->nRefCount).super___atomic_base<int>._M_i =
         ((*ppCVar3)->nRefCount).super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  ppCVar3 = (this->m_nodes_copy).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppCVar3 == (pointer)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(ppCVar3,(long)(this->m_nodes_copy).
                                  super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppCVar3);
    return;
  }
  __stack_chk_fail();
}

Assistant:

~NodesSnapshot()
        {
            for (auto& node : m_nodes_copy) {
                node->Release();
            }
        }